

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

vec2F __thiscall
crnlib::dxt_hc::palettize_alpha
          (dxt_hc *this,color_quad_u8 *pixels,uint pixels_count,uint comp_index)

{
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar1;
  vec2F vVar2;
  bool bVar3;
  byte *pbVar4;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar5;
  undefined4 in_register_00000014;
  undefined4 in_R8D;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float *local_2c8;
  vec<1U,_float> *local_2a8;
  vec<2U,_float> local_288;
  vec1F result [2];
  uint i;
  uint size;
  uint weights [64];
  vec1F vectors [64];
  uint local_6c;
  byte local_68 [4];
  uint p;
  uint8 alpha [64];
  uint comp_index_local;
  uint pixels_count_local;
  color_quad_u8 *pixels_local;
  dxt_hc *this_local;
  
  alpha._56_4_ = in_R8D;
  alpha._60_4_ = comp_index;
  for (local_6c = 0; local_6c < (uint)alpha._60_4_; local_6c = local_6c + 1) {
    pbVar4 = color_quad<unsigned_char,_int>::operator[]
                       ((color_quad<unsigned_char,_int> *)
                        (CONCAT44(in_register_00000014,pixels_count) + (ulong)local_6c * 4),
                        alpha._56_4_);
    local_68[local_6c] = *pbVar4;
  }
  std::sort<unsigned_char*>(local_68,local_68 + (uint)alpha._60_4_);
  local_2a8 = (vec<1U,_float> *)(weights + 0x3e);
  do {
    vec<1U,_float>::vec(local_2a8);
    local_2a8 = local_2a8 + 1;
  } while (local_2a8 != vectors + 0x3e);
  result[1].m_s[0] = (float  [1])0.0;
  for (result[0].m_s[0] = (float  [1])0.0; (uint)result[0].m_s[0] < (uint)alpha._60_4_;
      result[0].m_s[0] = (float  [1])((int)result[0].m_s[0] + 1)) {
    if ((result[0].m_s[0] == 0.0) ||
       (local_68[(uint)result[0].m_s[0]] != local_68[(int)result[0].m_s[0] - 1])) {
      aVar1 = pixels[(ulong)local_68[(uint)result[0].m_s[0]] + 0x8d].field_0;
      paVar5 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
               vec<1U,_float>::operator[]
                         ((vec<1U,_float> *)(weights + (ulong)(uint)result[1].m_s[0] + 0x3e),0);
      *paVar5 = aVar1;
      (&i)[(uint)result[1].m_s[0]] = 1;
      result[1].m_s[0] = (float  [1])((int)result[1].m_s[0] + 1);
    }
    else {
      (&i)[(int)result[1].m_s[0] - 1U] = (&i)[(int)result[1].m_s[0] - 1U] + 1;
    }
  }
  local_2c8 = local_288.m_s;
  do {
    vec<1U,_float>::vec((vec<1U,_float> *)local_2c8);
    local_2c8 = local_2c8 + 1;
  } while ((vec1F *)local_2c8 != result);
  split_vectors<crnlib::vec<1u,float>>
            ((vec<1U,_float> (*) [64])(weights + 0x3e),(uint (*) [64])&i,(uint)result[1].m_s[0],
             (vec<1U,_float> (*) [2])&local_288);
  bVar3 = helpers::operator>((vec<1U,_float> *)&local_288,(vec<1U,_float> *)(local_288.m_s + 1));
  if (bVar3) {
    std::swap<crnlib::vec<1u,float>>
              ((vec<1U,_float> *)&local_288,(vec<1U,_float> *)(local_288.m_s + 1));
  }
  vec<2U,_float>::vec((vec<2U,_float> *)this,&local_288);
  vVar2.m_s[1] = extraout_XMM0_Db;
  vVar2.m_s[0] = extraout_XMM0_Da;
  return (vec2F)vVar2.m_s;
}

Assistant:

vec2F dxt_hc::palettize_alpha(color_quad_u8* pixels, uint pixels_count, uint comp_index)
    {
        uint8 alpha[64];
        for (uint p = 0; p < pixels_count; p++)
        {
            alpha[p] = pixels[p][comp_index];
        }
        std::sort(alpha, alpha + pixels_count);
        vec1F vectors[64];
        uint weights[64];
        uint size = 0;
        for (uint i = 0; i < pixels_count; i++)
        {
            if (!i || alpha[i] != alpha[i - 1])
            {
                vectors[size][0] = m_uint8_to_float[alpha[i]];
                weights[size] = 1;
                size++;
            }
            else
            {
                weights[size - 1]++;
            }
        }
        vec1F result[2];
        split_vectors<vec1F>(vectors, weights, size, result);
        if (result[0] > result[1])
        {
            std::swap(result[0], result[1]);
        }
        return *(vec2F*)result;
    }